

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetIncludeDirectoriesCommand.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_c8f1c6::TargetIncludeDirectoriesImpl::HandleDirectContent
          (TargetIncludeDirectoriesImpl *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool system)

{
  pointer pcVar1;
  pointer pbVar2;
  bool bVar3;
  string *psVar4;
  size_type sVar5;
  pointer in_name;
  string prefix;
  cmListFileBacktrace lfbt;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sdirs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  cmTarget *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  ulong local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  element_type *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  undefined1 local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  element_type *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b8 = tgt;
  cmMakefile::GetBacktrace((this->super_cmTargetPropCommandBase).Makefile);
  (*(this->super_cmTargetPropCommandBase)._vptr_cmTargetPropCommandBase[6])(&local_b0,this,content);
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_88->_M_use_count = local_88->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_88->_M_use_count = local_88->_M_use_count + 1;
    }
  }
  if (local_b0 == &local_a0) {
    local_70._8_8_ = local_a0._8_8_;
    local_80._0_8_ = &local_70;
  }
  else {
    local_80._0_8_ = local_b0;
  }
  local_70._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
  local_70._M_local_buf[0] = local_a0._M_local_buf[0];
  local_80._8_8_ = local_a8;
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_60 = local_90;
  local_58._M_pi = local_88;
  local_b0 = &local_a0;
  cmTarget::InsertInclude
            (local_b8,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_80,prepend);
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._0_8_ != &local_70) {
    operator_delete((void *)local_80._0_8_,local_70._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0])
                             + 1);
  }
  if (system) {
    psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                       ((this->super_cmTargetPropCommandBase).Makefile);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    pcVar1 = (psVar4->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar1,pcVar1 + psVar4->_M_string_length);
    std::__cxx11::string::append((char *)&local_d8);
    local_70._8_8_ = local_80 + 8;
    local_80._8_8_ = local_80._8_8_ & 0xffffffff00000000;
    local_70._M_allocated_capacity = 0;
    local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    in_name = (content->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (content->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_60 = (element_type *)local_70._8_8_;
    if (in_name != pbVar2) {
      do {
        bVar3 = cmsys::SystemTools::FileIsFullPath(in_name);
        if (bVar3) {
LAB_002c7754:
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_80,in_name);
        }
        else {
          sVar5 = cmGeneratorExpression::Find(in_name);
          if (sVar5 == 0) goto LAB_002c7754;
          std::operator+(&local_50,&local_d8,in_name);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_80,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._0_8_ + 1);
          }
        }
        in_name = in_name + 1;
      } while (in_name != pbVar2);
    }
    cmTarget::AddSystemIncludeDirectories
              (local_b8,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_80);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  return true;
}

Assistant:

bool TargetIncludeDirectoriesImpl::HandleDirectContent(
  cmTarget* tgt, const std::vector<std::string>& content, bool prepend,
  bool system)
{
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
  tgt->InsertInclude(BT<std::string>(this->Join(content), lfbt), prepend);
  if (system) {
    std::string prefix = this->Makefile->GetCurrentSourceDirectory() + "/";
    std::set<std::string> sdirs;
    for (std::string const& it : content) {
      if (cmSystemTools::FileIsFullPath(it) ||
          cmGeneratorExpression::Find(it) == 0) {
        sdirs.insert(it);
      } else {
        sdirs.insert(prefix + it);
      }
    }
    tgt->AddSystemIncludeDirectories(sdirs);
  }
  return true; // Successfully handled.
}